

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O3

_Bool Open_JTalk_load_voice(Open_JTalk *open_jtalk,char *fn_voice)

{
  HTS_Boolean HVar1;
  int iVar2;
  char *__s1;
  char *local_18;
  
  if ((fn_voice != (char *)0x0 && open_jtalk != (Open_JTalk *)0x0) && (*fn_voice != '\0')) {
    local_18 = fn_voice;
    iVar2 = JPCommon_get_label_size(&open_jtalk->jpcommon);
    if (2 < iVar2) {
      HTS_Engine_refresh(&open_jtalk->engine);
    }
    JPCommon_refresh(&open_jtalk->jpcommon);
    NJD_refresh(&open_jtalk->njd);
    HVar1 = HTS_Engine_load(&open_jtalk->engine,&local_18,1);
    if (HVar1 == '\x01') {
      __s1 = HTS_Engine_get_fullcontext_label_format(&open_jtalk->engine);
      iVar2 = strcmp(__s1,"HTS_TTS_JPN");
      if (iVar2 == 0) {
        return true;
      }
    }
    Open_JTalk_clear(open_jtalk);
  }
  return false;
}

Assistant:

bool Open_JTalk_load_voice(Open_JTalk *open_jtalk, char *fn_voice)
{
	if (open_jtalk == NULL || fn_voice == NULL || strlen(fn_voice) == 0)
	{
		return false;
	}

	if (JPCommon_get_label_size(&open_jtalk->jpcommon) > 2)
	{
		HTS_Engine_refresh(&open_jtalk->engine);
	}
	JPCommon_refresh(&open_jtalk->jpcommon);
	NJD_refresh(&open_jtalk->njd);

	if (HTS_Engine_load(&open_jtalk->engine, &fn_voice, 1) != true)
	{
		Open_JTalk_clear(open_jtalk);
		return false;
	}
	if (strcmp(HTS_Engine_get_fullcontext_label_format(&open_jtalk->engine), "HTS_TTS_JPN") != 0)
	{
		Open_JTalk_clear(open_jtalk);
		return false;
	}
	return true;
}